

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_decoder.cc
# Opt level: O3

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> * __thiscall
draco::StlDecoder::DecodeFromFile
          (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>
           *__return_storage_ptr__,StlDecoder *this,string *file_name)

{
  bool bVar1;
  StlDecoder *this_00;
  vector<char,_std::allocator<char>_> data;
  DecoderBuffer buffer;
  vector<char,_std::allocator<char>_> local_88;
  undefined1 local_70 [8];
  BitDecoder *local_68;
  long local_60;
  BitDecoder local_58;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = ReadFileToBuffer(file_name,&local_88);
  if (bVar1) {
    DecoderBuffer::DecoderBuffer((DecoderBuffer *)local_70);
    this_00 = (StlDecoder *)
              local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    DecoderBuffer::Init((DecoderBuffer *)local_70,
                        local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
    DecodeFromBuffer(__return_storage_ptr__,this_00,(DecoderBuffer *)local_70);
    DecoderBuffer::BitDecoder::~BitDecoder(&local_58);
  }
  else {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Unable to read input file.","");
    local_70._0_4_ = IO_ERROR;
    local_68 = &local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_38,local_30 + (long)local_38);
    (__return_storage_ptr__->status_).code_ = local_70._0_4_;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->status_).error_msg_,local_68,
               (long)&local_68->bit_buffer_ + local_60);
    (__return_storage_ptr__->value_)._M_t.
    super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
    super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
    super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = (Mesh *)0x0;
    if (local_68 != &local_58) {
      operator_delete(local_68,(ulong)(local_58.bit_buffer_ + 1));
    }
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  if ((StlDecoder *)
      local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (StlDecoder *)0x0) {
    operator_delete(local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> StlDecoder::DecodeFromFile(
    const std::string &file_name) {
  std::vector<char> data;
  if (!ReadFileToBuffer(file_name, &data)) {
    return Status(Status::IO_ERROR, "Unable to read input file.");
  }
  DecoderBuffer buffer;
  buffer.Init(data.data(), data.size());
  return DecodeFromBuffer(&buffer);
}